

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnarySelectPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnarySelectPropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,SelectorSyntax **args_2,Token *args_3,
          PropertyExprSyntax *args_4)

{
  Token openBracket;
  Token op;
  UnarySelectPropertyExprSyntax *pUVar1;
  undefined8 *in_RDX;
  Token *in_RSI;
  undefined8 *in_R8;
  SelectorSyntax *in_R9;
  size_t in_stack_ffffffffffffff88;
  UnarySelectPropertyExprSyntax *in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pUVar1 = (UnarySelectPropertyExprSyntax *)
           allocate(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
  op.info = (Info *)*in_RDX;
  op._0_8_ = in_R8[1];
  openBracket.info = (Info *)*in_R8;
  openBracket._0_8_ = pUVar1;
  slang::syntax::UnarySelectPropertyExprSyntax::UnarySelectPropertyExprSyntax
            (in_stack_ffffffffffffff90,op,openBracket,in_R9,*in_RSI,(PropertyExprSyntax *)in_R9);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }